

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O2

void __thiscall
ElementsAddressFactory_CheckConfidentialAddressNetType_Test::TestBody
          (ElementsAddressFactory_CheckConfidentialAddressNetType_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper AStack_598;
  AssertHelper local_590;
  AssertionResult gtest_ar__7;
  Script script;
  ElementsAddressFactory factory;
  ElementsConfidentialAddress local_518;
  ConfidentialKey confidential_key;
  Pubkey pubkey;
  ElementsConfidentialAddress conf_addr;
  Address addr;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (&factory,kLiquidV1,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &conf_addr);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &conf_addr);
  std::__cxx11::string::string
            ((string *)&conf_addr,
             "02adc4593dedbc9f03b87f636491d24965b4becb7bd546eb20cc230a7bb9384c59",
             (allocator *)&local_518);
  cfd::core::Pubkey::Pubkey(&confidential_key,(string *)&conf_addr);
  std::__cxx11::string::~string((string *)&conf_addr);
  std::__cxx11::string::string
            ((string *)&conf_addr,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
             (allocator *)&local_518);
  cfd::core::Pubkey::Pubkey(&pubkey,(string *)&conf_addr);
  std::__cxx11::string::~string((string *)&conf_addr);
  cfd::core::Address::Address(&addr);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&conf_addr);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                (&local_518.unblinded_address_,&factory.super_AddressFactory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_518.unblinded_address_);
      cfd::core::Address::~Address(&local_518.unblinded_address_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x174,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&script,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_518);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::GetConfidentialAddress(&local_518,&addr,&confidential_key);
      cfd::core::ElementsConfidentialAddress::operator=(&conf_addr,&local_518);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_518);
    }
  }
  else {
    testing::Message::Message((Message *)&local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x175,
               "Expected: conf_addr = factory.GetConfidentialAddress(addr, confidential_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&script,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_518);
  }
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType(&factory,&conf_addr,kMainnet)
  ;
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&script,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x176,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_598,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&AStack_598);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType(&factory,&conf_addr,kTestnet)
  ;
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&script,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x177,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_598,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&AStack_598);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType(&factory,&conf_addr,kRegtest)
  ;
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&script,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x178,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_598,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&AStack_598);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  script._vptr_Script._0_1_ =
       cfd::ElementsAddressFactory::CheckConfidentialAddressNetType(&factory,&conf_addr,kLiquidV1);
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (!(bool)script._vptr_Script._0_1_) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&script,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x179,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_598,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&AStack_598);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (&factory,&conf_addr,kElementsRegtest);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&script,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17a,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_598,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&AStack_598);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (&factory,&conf_addr,kCustomChain);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&script,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17b,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_598,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&AStack_598);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (&factory,&conf_addr,kCustomChain);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&script,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17c,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_598,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper(&AStack_598);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__7);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_518,kElementsRegtest,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &script);
  cfd::AddressFactory::operator=(&factory.super_AddressFactory,(AddressFactory *)&local_518);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)&local_518);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &script);
  std::__cxx11::string::string
            ((string *)&local_518,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac",
             (allocator *)&gtest_ar__7);
  cfd::core::Script::Script(&script,(string *)&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress
                (&local_518.unblinded_address_,&factory.super_AddressFactory,&script);
      cfd::core::Address::operator=(&addr,&local_518.unblinded_address_);
      cfd::core::Address::~Address(&local_518.unblinded_address_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x180,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_518);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::GetConfidentialAddress(&local_518,&addr,&confidential_key);
      cfd::core::ElementsConfidentialAddress::operator=(&conf_addr,&local_518);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_518);
    }
  }
  else {
    testing::Message::Message((Message *)&local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x181,
               "Expected: conf_addr = factory.GetConfidentialAddress(addr, confidential_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_518);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory.super_AddressFactory,&addr,kMainnet);
  gtest_ar__7.success_ = !bVar1;
  gtest_ar__7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&gtest_ar__7,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x182,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&AStack_598);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_598);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__7.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory.super_AddressFactory,&addr,kTestnet);
  gtest_ar__7.success_ = !bVar1;
  gtest_ar__7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&gtest_ar__7,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x183,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&AStack_598);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_598);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__7.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory.super_AddressFactory,&addr,kRegtest);
  gtest_ar__7.success_ = !bVar1;
  gtest_ar__7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&gtest_ar__7,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x184,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&AStack_598);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_598);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__7.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory.super_AddressFactory,&addr,kLiquidV1);
  gtest_ar__7.success_ = !bVar1;
  gtest_ar__7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&gtest_ar__7,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x185,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&AStack_598);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_598);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__7.message_);
  gtest_ar__7.success_ =
       cfd::AddressFactory::CheckAddressNetType
                 (&factory.super_AddressFactory,&addr,kElementsRegtest);
  gtest_ar__7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__7.success_) {
    testing::Message::Message((Message *)&AStack_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&gtest_ar__7,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x186,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&AStack_598);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_598);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__7.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory.super_AddressFactory,&addr,kCustomChain)
  ;
  gtest_ar__7.success_ = !bVar1;
  gtest_ar__7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&gtest_ar__7,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x187,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&AStack_598);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_598);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__7.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory.super_AddressFactory,&addr,kCustomChain)
  ;
  gtest_ar__7.success_ = !bVar1;
  gtest_ar__7.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&AStack_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_518,(internal *)&gtest_ar__7,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x188,(char *)local_518.unblinded_address_._0_8_);
    testing::internal::AssertHelper::operator=(&local_590,(Message *)&AStack_598);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&local_518);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_598);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__7.message_);
  cfd::core::Script::~Script(&script);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&conf_addr);
  cfd::core::Address::~Address(&addr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&confidential_key);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CheckConfidentialAddressNetType)
{
  ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  ConfidentialKey confidential_key = ConfidentialKey("02adc4593dedbc9f03b87f636491d24965b4becb7bd546eb20cc230a7bb9384c59");
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  ElementsConfidentialAddress conf_addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_NO_THROW(conf_addr = factory.GetConfidentialAddress(addr, confidential_key));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kNetTypeNum));

  factory = ElementsAddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_NO_THROW(conf_addr = factory.GetConfidentialAddress(addr, confidential_key));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}